

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O1

bool __thiscall internalJSONNode::IsEqualTo(internalJSONNode *this,internalJSONNode *val)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uchar uVar2;
  json_index_t jVar3;
  uint uVar4;
  size_t sVar5;
  jsonChildren *pjVar6;
  JSONNode *pJVar7;
  JSONNode *pJVar8;
  int iVar9;
  JSONNode **ppJVar10;
  JSONNode **ppJVar11;
  bool bVar12;
  double dVar13;
  size_type __dnew;
  size_type local_68;
  json_string local_60;
  JSONNode **local_40;
  JSONNode **local_38;
  
  if (this == val) {
    return true;
  }
  uVar2 = this->_type;
  if (((uVar2 == val->_type) &&
      (sVar5 = (this->_name)._M_string_length, sVar5 == (val->_name)._M_string_length)) &&
     ((sVar5 == 0 ||
      (iVar9 = bcmp((this->_name)._M_dataplus._M_p,(val->_name)._M_dataplus._M_p,sVar5), iVar9 == 0)
      ))) {
    if (uVar2 == '\0') {
      return true;
    }
    Fetch(this);
    Fetch(val);
    switch(this->_type) {
    case '\x01':
      sVar5 = (val->_string)._M_string_length;
      if (sVar5 != (this->_string)._M_string_length) {
        return false;
      }
      if (sVar5 != 0) {
        iVar9 = bcmp((val->_string)._M_dataplus._M_p,(this->_string)._M_dataplus._M_p,sVar5);
        return iVar9 == 0;
      }
      return true;
    case '\x02':
      dVar13 = (val->_value)._number - (this->_value)._number;
      if ((val->_value)._number <= (this->_value)._number) {
        return -1e-05 < dVar13;
      }
      return dVar13 < 1e-05;
    case '\x03':
      return (val->_value)._bool == (this->_value)._bool;
    case '\x04':
    case '\x05':
      bVar12 = true;
      break;
    default:
      bVar12 = false;
    }
    paVar1 = &local_60.field_2;
    local_68 = 0x29;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    local_60._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_60,(ulong)&local_68);
    local_60.field_2._M_allocated_capacity._0_7_ = (undefined7)local_68;
    local_60.field_2._M_local_buf[7] = (char)(local_68 >> 0x38);
    builtin_strncpy(local_60._M_dataplus._M_p,"Checking for equality, not sure what type",0x29);
    local_60._M_string_length = local_68;
    local_60._M_dataplus._M_p[local_68] = '\0';
    JSONDebug::_JSON_ASSERT(bVar12,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    pjVar6 = this->Children;
    local_68 = 0x15;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    local_60._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_60,(ulong)&local_68);
    local_60.field_2._M_allocated_capacity._0_7_ = (undefined7)local_68;
    local_60.field_2._M_local_buf[7] = (char)(local_68 >> 0x38);
    builtin_strncpy(local_60._M_dataplus._M_p,"Children is null size",0x15);
    local_60._M_string_length = local_68;
    local_60._M_dataplus._M_p[local_68] = '\0';
    JSONDebug::_JSON_ASSERT(true,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    jVar3 = pjVar6->mysize;
    pjVar6 = val->Children;
    local_68 = 0x15;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    local_60._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_60,(ulong)&local_68);
    local_60.field_2._M_allocated_capacity._0_7_ = (undefined7)local_68;
    local_60.field_2._M_local_buf[7] = (char)(local_68 >> 0x38);
    *(undefined8 *)local_60._M_dataplus._M_p = 0x6e6572646c696843;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p + 8) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p + 9) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p + 10) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p + 0xb) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p + 0xc) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p + 0xd) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p + 0xe) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p + 0xf) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p + 0xd) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p + 0xe) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p + 0xf) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p + 0x10) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p + 0x11) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p + 0x12) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p + 0x13) = 'z';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p + 0x14) = 'e';
    local_60._M_string_length = local_68;
    local_60._M_dataplus._M_p[local_68] = '\0';
    JSONDebug::_JSON_ASSERT(true,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (jVar3 == pjVar6->mysize) {
      ppJVar10 = jsonChildren::begin(val->Children);
      ppJVar11 = jsonChildren::begin(this->Children);
      local_38 = jsonChildren::end(this->Children);
      bVar12 = ppJVar11 == local_38;
      while( true ) {
        if (bVar12) {
          return bVar12;
        }
        pJVar7 = *ppJVar11;
        if (jsonSingletonERROR_NULL_IN_CHILDREN::getValue[abi:cxx11]()::single == '\0') {
          IsEqualTo();
        }
        JSONDebug::_JSON_ASSERT
                  (pJVar7 != (JSONNode *)0x0,
                   (json_string *)jsonSingletonERROR_NULL_IN_CHILDREN::getValue[abi:cxx11]()::single
                  );
        pJVar7 = *ppJVar10;
        if (jsonSingletonERROR_NULL_IN_CHILDREN::getValue[abi:cxx11]()::single == '\0') {
          IsEqualTo();
        }
        JSONDebug::_JSON_ASSERT
                  (pJVar7 != (JSONNode *)0x0,
                   (json_string *)jsonSingletonERROR_NULL_IN_CHILDREN::getValue[abi:cxx11]()::single
                  );
        pjVar6 = val->Children;
        local_68 = 0x14;
        local_60._M_dataplus._M_p = (pointer)paVar1;
        local_60._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_60,(ulong)&local_68);
        local_60.field_2._M_allocated_capacity._0_7_ = (undefined7)local_68;
        local_60.field_2._M_local_buf[7] = (char)(local_68 >> 0x38);
        builtin_strncpy(local_60._M_dataplus._M_p,"Children is null end",0x14);
        local_60._M_string_length = local_68;
        local_60._M_dataplus._M_p[local_68] = '\0';
        local_40 = ppJVar10;
        JSONDebug::_JSON_ASSERT(true,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        ppJVar10 = pjVar6->array;
        uVar4 = pjVar6->mysize;
        local_68 = 0x3e;
        local_60._M_dataplus._M_p = (pointer)paVar1;
        local_60._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_60,(ulong)&local_68);
        local_60.field_2._M_allocated_capacity._0_7_ = (undefined7)local_68;
        local_60.field_2._M_local_buf[7] = (char)(local_68 >> 0x38);
        builtin_strncpy(local_60._M_dataplus._M_p,
                        "at the end of other one\'s children, but they\'re the same size?",0x3e);
        local_60._M_string_length = local_68;
        local_60._M_dataplus._M_p[local_68] = '\0';
        JSONDebug::_JSON_ASSERT(local_40 != ppJVar10 + uVar4,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        ppJVar10 = local_40;
        pJVar7 = *ppJVar11;
        pJVar8 = *local_40;
        local_60.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
        local_60.field_2._7_4_ = 0x6c616e72;
        local_60._M_string_length = 0xb;
        local_60.field_2._M_local_buf[0xb] = '\0';
        local_60._M_dataplus._M_p = (pointer)paVar1;
        JSONDebug::_JSON_ASSERT(pJVar7->internal != (internalJSONNode *)0x0,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        local_60.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
        local_60.field_2._7_4_ = 0x6c616e72;
        local_60._M_string_length = 0xb;
        local_60.field_2._M_local_buf[0xb] = '\0';
        local_60._M_dataplus._M_p = (pointer)paVar1;
        JSONDebug::_JSON_ASSERT(pJVar7->internal != (internalJSONNode *)0x0,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        bVar12 = IsEqualTo(pJVar7->internal,pJVar8->internal);
        if (!bVar12) break;
        ppJVar10 = ppJVar10 + 1;
        ppJVar11 = ppJVar11 + 1;
        bVar12 = ppJVar11 == local_38;
      }
    }
  }
  return false;
}

Assistant:

bool internalJSONNode::IsEqualTo(const internalJSONNode * val) const json_nothrow {
    if (this == val) return true;  //same internal object, so they must be equal (not only for ref counting)
    if (type() != val -> type()) return false;	 //aren't even same type
    if (_name != val -> _name) return false;  //names aren't the same
    if (type() == JSON_NULL) return true;  //both null, can't be different
    #if !defined(JSON_PREPARSE) && defined(JSON_READ_PRIORITY) 
	   Fetch();
	   val -> Fetch();
    #endif 
    switch (type()){
	   case JSON_STRING:
		  return val -> _string == _string;
	   case JSON_NUMBER:
		  return _floatsAreEqual(val -> _value._number, _value._number);
	   case JSON_BOOL:
		  return val -> _value._bool == _value._bool;
    };

    JSON_ASSERT(type() == JSON_NODE || type() == JSON_ARRAY, JSON_TEXT("Checking for equality, not sure what type"));
    if (CHILDREN -> size() != val -> CHILDREN -> size()) return false;  //if they arne't he same size then they certainly aren't equal

    //make sure each children is the same
    JSONNode ** valrunner = val -> CHILDREN -> begin();
    json_foreach(CHILDREN, myrunner){
        JSON_ASSERT(*myrunner != NULL, json_global(ERROR_NULL_IN_CHILDREN));
		JSON_ASSERT(*valrunner != NULL, json_global(ERROR_NULL_IN_CHILDREN));
		JSON_ASSERT(valrunner != val -> CHILDREN -> end(), JSON_TEXT("at the end of other one's children, but they're the same size?"));
        if (**myrunner != **valrunner) return false;
		++valrunner;
    }
    return true;
}